

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseEntityRefInternal(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlChar *pxVar2;
  
  pxVar1 = ctxt->input;
  if (((pxVar1->flags & 0x40) == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar1 = ctxt->input;
  }
  if (*pxVar1->cur == '&') {
    xmlNextChar(ctxt);
    pxVar2 = xmlParseName(ctxt);
    if (pxVar2 != (xmlChar *)0x0) {
      if (*ctxt->input->cur == ';') {
        xmlNextChar(ctxt);
        return pxVar2;
      }
      xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
      return (xmlChar *)0x0;
    }
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseEntityRef: no name\n");
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlParseEntityRefInternal(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;

    GROW;

    if (RAW != '&')
        return(NULL);
    NEXT;
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseEntityRef: no name\n");
        return(NULL);
    }
    if (RAW != ';') {
	xmlFatalErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING, NULL);
	return(NULL);
    }
    NEXT;

    return(name);
}